

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.hpp
# Opt level: O2

void __thiscall OpenMD::SimCreator::~SimCreator(SimCreator *this)

{
  ~SimCreator(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~SimCreator() = default;